

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_alloc.h
# Opt level: O0

void release_compound_type_rd_buffers(CompoundTypeRdBuffers *bufs)

{
  void *in_RDI;
  
  aom_free(bufs);
  aom_free(bufs);
  aom_free(bufs);
  aom_free(bufs);
  aom_free(bufs);
  memset(in_RDI,0,0x28);
  return;
}

Assistant:

static inline void release_compound_type_rd_buffers(
    CompoundTypeRdBuffers *const bufs) {
  aom_free(bufs->pred0);
  aom_free(bufs->pred1);
  aom_free(bufs->residual1);
  aom_free(bufs->diff10);
  aom_free(bufs->tmp_best_mask_buf);
  av1_zero(*bufs);  // Set all pointers to NULL for safety.
}